

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_fcmla_zpzzz_d_aarch64(CPUARMState_conflict *env,void *vg,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  float64 fVar8;
  float64 fVar9;
  long lVar10;
  float64 fVar11;
  float64 fVar12;
  bool bVar13;
  ulong local_f0;
  ulong local_e8;
  bool local_d1;
  float64 d;
  float64 mi;
  float64 mr;
  float64 ni;
  float64 nr;
  float64 e4;
  float64 e3;
  float64 e2;
  float64 e1;
  uint64_t pg;
  uint64_t *g;
  void *va;
  void *vm;
  void *vn;
  void *vd;
  float64 neg_real;
  float64 neg_imag;
  _Bool flip;
  uint rot;
  uint ra;
  uint rm;
  uint rn;
  uint rd;
  intptr_t i;
  intptr_t j;
  uint32_t desc_local;
  void *vg_local;
  CPUARMState_conflict *env_local;
  
  _rn = simd_oprsz(desc);
  uVar3 = extract32(desc,10,5);
  uVar4 = extract32(desc,0xf,5);
  uVar5 = extract32(desc,0x14,5);
  uVar6 = extract32(desc,0x19,5);
  uVar7 = extract32(desc,0x1e,2);
  bVar13 = (uVar7 & 1) != 0;
  fVar8 = float64_set_sign(0,(uint)((uVar7 & 2) != 0));
  local_d1 = uVar7 == 1 || uVar7 == 2;
  fVar9 = float64_set_sign(0,(uint)local_d1);
  do {
    uVar1 = *(ulong *)((long)vg + ((long)(_rn - 1) >> 6) * 8);
    do {
      lVar10 = _rn - 8;
      _rn = _rn - 0x10;
      fVar12 = *(float64 *)((long)(env->vfp).zregs[uVar4].d + _rn);
      uVar2 = *(ulong *)((long)(env->vfp).zregs[uVar5].d + _rn);
      local_f0 = *(ulong *)((long)(env->vfp).zregs[uVar5].d + lVar10);
      local_e8 = uVar2;
      if (bVar13) {
        local_e8 = local_f0;
        fVar12 = *(float64 *)((long)(env->vfp).zregs[uVar4].d + lVar10);
      }
      if (bVar13) {
        local_f0 = uVar2;
      }
      if ((uVar1 >> ((byte)_rn & 0x3f) & 1) != 0) {
        fVar11 = float64_muladd_aarch64
                           (fVar12,local_e8 ^ fVar9,
                            *(float64 *)((long)(env->vfp).zregs[uVar6].d + _rn),0,
                            &(env->vfp).fp_status);
        *(float64 *)((long)(env->vfp).zregs[uVar3].d + _rn) = fVar11;
      }
      if ((uVar1 >> ((byte)lVar10 & 0x3f) & 1) != 0) {
        fVar12 = float64_muladd_aarch64
                           (fVar12,local_f0 ^ fVar8,
                            *(float64 *)((long)(env->vfp).zregs[uVar6].d + lVar10),0,
                            &(env->vfp).fp_status);
        *(float64 *)((long)(env->vfp).zregs[uVar3].d + lVar10) = fVar12;
      }
    } while ((_rn & 0x3f) != 0);
  } while (_rn != 0);
  return;
}

Assistant:

void HELPER(sve_fcmla_zpzzz_d)(CPUARMState *env, void *vg, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    unsigned rd = extract32(desc, SIMD_DATA_SHIFT, 5);
    unsigned rn = extract32(desc, SIMD_DATA_SHIFT + 5, 5);
    unsigned rm = extract32(desc, SIMD_DATA_SHIFT + 10, 5);
    unsigned ra = extract32(desc, SIMD_DATA_SHIFT + 15, 5);
    unsigned rot = extract32(desc, SIMD_DATA_SHIFT + 20, 2);
    bool flip = rot & 1;
    float64 neg_imag, neg_real;
    void *vd = &env->vfp.zregs[rd];
    void *vn = &env->vfp.zregs[rn];
    void *vm = &env->vfp.zregs[rm];
    void *va = &env->vfp.zregs[ra];
    uint64_t *g = vg;

    neg_imag = float64_set_sign(0, (rot & 2) != 0);
    neg_real = float64_set_sign(0, rot == 1 || rot == 2);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float64 e1, e2, e3, e4, nr, ni, mr, mi, d;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float64);
            i -= 2 * sizeof(float64);

            nr = *(float64 *)((char *)vn + H1_2(i));
            ni = *(float64 *)((char *)vn + H1_2(j));
            mr = *(float64 *)((char *)vm + H1_2(i));
            mi = *(float64 *)((char *)vm + H1_2(j));

            e2 = (flip ? ni : nr);
            e1 = (flip ? mi : mr) ^ neg_real;
            e4 = e2;
            e3 = (flip ? mr : mi) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                d = *(float64 *)((char *)va + H1_2(i));
                d = float64_muladd(e2, e1, d, 0, &env->vfp.fp_status);
                *(float64 *)((char *)vd + H1_2(i)) = d;
            }
            if (likely((pg >> (j & 63)) & 1)) {
                d = *(float64 *)((char *)va + H1_2(j));
                d = float64_muladd(e4, e3, d, 0, &env->vfp.fp_status);
                *(float64 *)((char *)vd + H1_2(j)) = d;
            }
        } while (i & 63);
    } while (i != 0);
}